

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Packet.cpp
# Opt level: O0

Packet * __thiscall mognetwork::Packet::operator<<(Packet *this,uint32_t data)

{
  uint32_t in_ESI;
  Packet *in_RDI;
  Packet *unaff_retaddr;
  uint32_t write;
  Packet *data_00;
  
  data_00 = in_RDI;
  htonl(in_ESI);
  push(unaff_retaddr,data_00,in_ESI);
  return in_RDI;
}

Assistant:

Packet& Packet::operator<<(uint32_t data)
  {
    uint32_t write = htonl(data);
    push(&write, sizeof(write));
    return (*this);
  }